

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O1

vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
* __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::derivatives_at(vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 *__return_storage_ptr__,
                CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                *this,double t,Index order)

{
  undefined8 *puVar1;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pvVar2;
  element_type *peVar3;
  pointer pMVar4;
  _Any_data *p_Var5;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *pvVar6;
  ActualDstType actualDst;
  long lVar7;
  size_type __args;
  function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> c;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  surface_derivatives;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  curve_derivatives;
  anon_class_24_3_7c38b2f8 local_a8;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  local_60;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_48;
  
  (*(((this->m_curve_geometry).
      super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_CurveBase<2L>)._vptr_CurveBase[6])(SUB84(t,0),&local_48);
  peVar3 = (this->m_surface_geometry).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
            (SUB84(((local_48.
                     super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
                   array[0],0),
             SUB84(((local_48.
                     super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
                   array[1],0),&local_60,peVar3,order);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(__return_storage_ptr__,order + 1U,(allocator_type *)local_88._M_pod_data);
  local_78 = (code *)0x0;
  uStack_70 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_a8.c = (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)&local_88;
  local_a8.curve_derivatives = &local_48;
  local_a8.surface_derivatives = &local_60;
  std::function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)>::operator=
            ((function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)> *)local_88._M_pod_data,
             &local_a8);
  if (-1 < order) {
    lVar7 = 0x10;
    __args = 0;
    do {
      std::function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)>::operator()
                ((Matrix<double,_1,_3,_1,_1,_3> *)&local_a8,
                 (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)&local_88,
                 __args,0,0);
      pMVar4 = (__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                      m_storage.m_data.array + lVar7 + -0x10);
      p_Var5 = (_Any_data *)*puVar1;
      pvVar6 = (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)puVar1[1];
      puVar1 = (undefined8 *)
               ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                      m_storage.m_data.array + lVar7 + -0x10);
      *puVar1 = local_a8.c;
      puVar1[1] = local_a8.curve_derivatives;
      pvVar2 = *(vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 **)((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                           m_storage.m_data.array + lVar7);
      *(vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        **)((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                  m_data.array + lVar7) = local_a8.surface_derivatives;
      __args = __args + 1;
      lVar7 = lVar7 + 0x18;
      local_a8.c = (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)p_Var5;
      local_a8.curve_derivatives = pvVar6;
      local_a8.surface_derivatives = pvVar2;
    } while (order + 1U != __args);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_60.
      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order)
        const override
    {
        // derivatives of base geometries

        const auto curve_derivatives =
            m_curve_geometry->derivatives_at(t, order);

        const double u = curve_derivatives[0][0];
        const double v = curve_derivatives[0][1];

        const auto surface_derivatives =
            m_surface_geometry->derivatives_at(u, v, order);

        // compute combined derivatives

        std::vector<Vector> derivatives(order + 1);

        std::function<Vector(Index, Index, Index)> c;

        c = [&](Index order, Index i, Index j) -> Vector {
            if (order > 0) {
                Vector result = Vector::Zero();

                for (Index a = 1; a <= order; a++) {
                    result += (
                        c(order - a, i + 1, j) * curve_derivatives[a][0] +
                        c(order - a, i, j + 1) * curve_derivatives[a][1]
                    ) * Math::binom(order - 1, a - 1);
                }

                return result;
            } else {
                const Index index = NurbsSurfaceShapeFunction::shape_index(i, j);
                return surface_derivatives[index];
            }
        };

        for (Index i = 0; i <= order; i++) {
            derivatives[i] = c(i, 0, 0);
        }

        return derivatives;
    }